

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O0

int Test_SUNMatScaleAdd(SUNMatrix A,SUNMatrix I,int myid)

{
  uint uVar1;
  int iVar2;
  SUNMatrix B_00;
  SUNMatrix B_01;
  SUNMatrix B_02;
  double dVar3;
  double dVar4;
  realtype tol;
  SUNMatrix D;
  SUNMatrix C;
  SUNMatrix B;
  double stop_time;
  double start_time;
  int failure;
  int myid_local;
  SUNMatrix I_local;
  SUNMatrix A_local;
  
  B_00 = SUNMatClone(A);
  uVar1 = SUNMatCopy(A,B_00);
  if (uVar1 == 0) {
    dVar3 = get_time();
    uVar1 = SUNMatScaleAdd(-1.0,B_00,B_00);
    dVar4 = get_time();
    if (uVar1 == 0) {
      iVar2 = check_matrix_entry(B_00,0.0,2.220446049250313e-15);
      if (iVar2 == 0) {
        if ((myid == 0) && (printf("    PASSED test -- SUNMatScaleAdd case 1 \n"), print_time != 0))
        {
          printf("    SUNMatScaleAdd Time: %22.15e \n \n",dVar4 - dVar3);
        }
        iVar2 = is_square(A);
        if (iVar2 != 0) {
          B_01 = SUNMatClone(A);
          uVar1 = SUNMatCopy(A,B_01);
          if (uVar1 != 0) {
            printf(">>> FAILED test -- SUNMatCopy returned %d on Proc %d \n",(ulong)uVar1,
                   (ulong)(uint)myid);
            SUNMatDestroy(B_00);
            SUNMatDestroy(B_01);
            return 1;
          }
          B_02 = SUNMatClone(I);
          uVar1 = SUNMatCopy(I,B_02);
          if (uVar1 != 0) {
            printf(">>> FAILED test -- SUNMatCopy returned %d on Proc %d \n",(ulong)uVar1,
                   (ulong)(uint)myid);
            SUNMatDestroy(B_00);
            SUNMatDestroy(B_02);
            SUNMatDestroy(B_01);
            return 1;
          }
          dVar3 = get_time();
          uVar1 = SUNMatScaleAdd(1.0,B_01,I);
          if (uVar1 != 0) {
            printf(">>> FAILED test -- SUNMatScaleAdd returned %d on Proc %d \n",(ulong)uVar1,
                   (ulong)(uint)myid);
            SUNMatDestroy(B_00);
            SUNMatDestroy(B_02);
            SUNMatDestroy(B_01);
            return 1;
          }
          uVar1 = SUNMatScaleAdd(1.0,B_02,A);
          if (uVar1 != 0) {
            printf(">>> FAILED test -- SUNMatScaleAdd returned %d on Proc %d \n",(ulong)uVar1,
                   (ulong)(uint)myid);
            SUNMatDestroy(B_00);
            SUNMatDestroy(B_02);
            SUNMatDestroy(B_01);
            return 1;
          }
          dVar4 = get_time();
          iVar2 = check_matrix(B_01,B_02,2.220446049250313e-15);
          if (iVar2 != 0) {
            printf(">>> FAILED test -- SUNMatScaleAdd case 2 check, Proc %d \n",(ulong)(uint)myid);
            if (print_time != 0) {
              printf("    SUNMatScaleAdd Time: %22.15e \n \n",dVar4 - dVar3);
            }
            SUNMatDestroy(B_00);
            SUNMatDestroy(B_02);
            SUNMatDestroy(B_01);
            return 1;
          }
          if ((myid == 0) &&
             (printf("    PASSED test -- SUNMatScaleAdd case 2 \n"), print_time != 0)) {
            printf("    SUNMatScaleAdd Time: %22.15e \n \n",dVar4 - dVar3);
          }
          SUNMatDestroy(B_02);
          SUNMatDestroy(B_01);
        }
        SUNMatDestroy(B_00);
        A_local._4_4_ = 0;
      }
      else {
        printf(">>> FAILED test -- SUNMatScaleAdd case 1 check, Proc %d \n",(ulong)(uint)myid);
        if (print_time != 0) {
          printf("    SUNMatScaleAdd Time: %22.15e \n \n",dVar4 - dVar3);
        }
        SUNMatDestroy(B_00);
        A_local._4_4_ = 1;
      }
    }
    else {
      printf(">>> FAILED test -- SUNMatScaleAdd returned %d on Proc %d \n",(ulong)uVar1,
             (ulong)(uint)myid);
      SUNMatDestroy(B_00);
      A_local._4_4_ = 1;
    }
  }
  else {
    printf(">>> FAILED test -- SUNMatCopy returned %d on Proc %d \n",(ulong)uVar1,(ulong)(uint)myid)
    ;
    SUNMatDestroy(B_00);
    A_local._4_4_ = 1;
  }
  return A_local._4_4_;
}

Assistant:

int Test_SUNMatScaleAdd(SUNMatrix A, SUNMatrix I, int myid)
{
  int       failure;
  double    start_time, stop_time;
  SUNMatrix B, C, D;
  realtype  tol=10*UNIT_ROUNDOFF;

  /*
   * Case 1: same sparsity/bandwith pattern
   */

  /* protect A */
  B = SUNMatClone(A);
  failure = SUNMatCopy(A, B);
  if (failure) {
    printf(">>> FAILED test -- SUNMatCopy returned %d on Proc %d \n",
           failure, myid);
    SUNMatDestroy(B);
    return(1);
  }

  /* fill vector data */
  start_time = get_time();
  failure = SUNMatScaleAdd(NEG_ONE, B, B);
  stop_time = get_time();

  if (failure) {
    printf(">>> FAILED test -- SUNMatScaleAdd returned %d on Proc %d \n",
           failure, myid);
    SUNMatDestroy(B);
    return(1);
  }

  /* check matrix entries */
  failure = check_matrix_entry(B, ZERO, tol);

  if (failure) {
    printf(">>> FAILED test -- SUNMatScaleAdd case 1 check, Proc %d \n", myid);
    PRINT_TIME("    SUNMatScaleAdd Time: %22.15e \n \n", stop_time - start_time);
    SUNMatDestroy(B);
    return(1);
  }
  else if (myid == 0) {
    printf("    PASSED test -- SUNMatScaleAdd case 1 \n");
    PRINT_TIME("    SUNMatScaleAdd Time: %22.15e \n \n", stop_time - start_time);
  }


  /*
   * Case 2: different sparsity/bandwith patterns
   */
  if (is_square(A)) {

    /* protect A and I */
    D = SUNMatClone(A);
    failure = SUNMatCopy(A, D);
    if (failure) {
      printf(">>> FAILED test -- SUNMatCopy returned %d on Proc %d \n",
             failure, myid);
      SUNMatDestroy(B);
      SUNMatDestroy(D);
      return(1);
    }
    C = SUNMatClone(I);
    failure = SUNMatCopy(I, C);
    if (failure) {
      printf(">>> FAILED test -- SUNMatCopy returned %d on Proc %d \n",
             failure, myid);
      SUNMatDestroy(B);
      SUNMatDestroy(C);
      SUNMatDestroy(D);
      return(1);
    }

    /* fill B and C */
    start_time = get_time();
    failure = SUNMatScaleAdd(ONE, D, I);
    if (failure) {
      printf(">>> FAILED test -- SUNMatScaleAdd returned %d on Proc %d \n",
             failure, myid);
      SUNMatDestroy(B);
      SUNMatDestroy(C);
      SUNMatDestroy(D);
      return(1);
    }
    failure = SUNMatScaleAdd(ONE, C, A);
    if (failure) {
      printf(">>> FAILED test -- SUNMatScaleAdd returned %d on Proc %d \n",
             failure, myid);
      SUNMatDestroy(B);
      SUNMatDestroy(C);
      SUNMatDestroy(D);
      return(1);
    }
    stop_time = get_time();

    /* check matrix entries */
    failure = check_matrix(D, C, tol);

    if (failure) {
      printf(">>> FAILED test -- SUNMatScaleAdd case 2 check, Proc %d \n", myid);
      PRINT_TIME("    SUNMatScaleAdd Time: %22.15e \n \n", stop_time - start_time);
      SUNMatDestroy(B);
      SUNMatDestroy(C);
      SUNMatDestroy(D);
      return(1);
    }
    else if (myid == 0) {
      printf("    PASSED test -- SUNMatScaleAdd case 2 \n");
      PRINT_TIME("    SUNMatScaleAdd Time: %22.15e \n \n", stop_time - start_time);
    }

    SUNMatDestroy(C);
    SUNMatDestroy(D);
  }

  SUNMatDestroy(B);

  return(0);
}